

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.hpp
# Opt level: O0

void Diligent::FilterTypeToGLFilterType
               (FILTER_TYPE Filter,GLenum *GLFilter,Bool *bIsAnisotropic,Bool *bIsComparison)

{
  Char *pCVar1;
  undefined1 local_78 [8];
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  Bool *bIsComparison_local;
  Bool *bIsAnisotropic_local;
  GLenum *GLFilter_local;
  FILTER_TYPE Filter_local;
  
  msg.field_2._8_8_ = bIsComparison;
  switch(Filter) {
  case FILTER_TYPE_UNKNOWN:
    FormatString<char[24]>((string *)local_48,(char (*) [24])"Unspecified filter type");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"FilterTypeToGLFilterType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x8b);
    std::__cxx11::string::~string((string *)local_48);
    *bIsAnisotropic = false;
    *(undefined1 *)msg.field_2._8_8_ = 0;
    *GLFilter = 0x2600;
    break;
  case FILTER_TYPE_POINT:
    *bIsAnisotropic = false;
    *bIsComparison = false;
    *GLFilter = 0x2600;
    break;
  case FILTER_TYPE_LINEAR:
    *bIsAnisotropic = false;
    *bIsComparison = false;
    *GLFilter = 0x2601;
    break;
  case FILTER_TYPE_ANISOTROPIC:
    *bIsAnisotropic = true;
    *bIsComparison = false;
    *GLFilter = 0x2601;
    break;
  case FILTER_TYPE_COMPARISON_POINT:
    *bIsAnisotropic = false;
    *bIsComparison = true;
    *GLFilter = 0x2600;
    break;
  case FILTER_TYPE_COMPARISON_LINEAR:
    *bIsAnisotropic = false;
    *bIsComparison = true;
    *GLFilter = 0x2601;
    break;
  case FILTER_TYPE_COMPARISON_ANISOTROPIC:
    *bIsAnisotropic = true;
    *bIsComparison = true;
    *GLFilter = 0x2601;
    break;
  default:
    FormatString<char[20]>((string *)local_78,(char (*) [20])"Unknown filter type");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"FilterTypeToGLFilterType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0xb6);
    std::__cxx11::string::~string((string *)local_78);
    *bIsAnisotropic = false;
    *(undefined1 *)msg.field_2._8_8_ = 0;
    *GLFilter = 0x2600;
  }
  return;
}

Assistant:

inline void FilterTypeToGLFilterType(FILTER_TYPE Filter, GLenum& GLFilter, Bool& bIsAnisotropic, Bool& bIsComparison)
{
    switch (Filter)
    {
        case FILTER_TYPE_UNKNOWN:
            UNEXPECTED("Unspecified filter type");
            bIsAnisotropic = false;
            bIsComparison  = false;
            GLFilter       = GL_NEAREST;
            break;

        case FILTER_TYPE_POINT:
            bIsAnisotropic = false;
            bIsComparison  = false;
            GLFilter       = GL_NEAREST;
            break;

        case FILTER_TYPE_LINEAR:
            bIsAnisotropic = false;
            bIsComparison  = false;
            GLFilter       = GL_LINEAR;
            break;

        case FILTER_TYPE_ANISOTROPIC:
            bIsAnisotropic = true;
            bIsComparison  = false;
            GLFilter       = GL_LINEAR;
            break;

        case FILTER_TYPE_COMPARISON_POINT:
            bIsAnisotropic = false;
            bIsComparison  = true;
            GLFilter       = GL_NEAREST;
            break;

        case FILTER_TYPE_COMPARISON_LINEAR:
            bIsAnisotropic = false;
            bIsComparison  = true;
            GLFilter       = GL_LINEAR;
            break;

        case FILTER_TYPE_COMPARISON_ANISOTROPIC:
            bIsAnisotropic = true;
            bIsComparison  = true;
            GLFilter       = GL_LINEAR;
            break;

        default:
            UNEXPECTED("Unknown filter type");
            bIsAnisotropic = false;
            bIsComparison  = false;
            GLFilter       = GL_NEAREST;
            break;
    }
}